

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O2

int picnic_sk_to_pk(picnic_privatekey_t *sk,picnic_publickey_t *pk)

{
  byte bVar1;
  picnic_instance_t *lowmc;
  ulong len;
  int iVar2;
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  mzd_local_t ciphertext [1];
  mzd_local_t local_c0;
  mzd_local_t local_a0;
  mzd_local_t local_80 [2];
  
  iVar2 = -1;
  if (pk != (picnic_publickey_t *)0x0 && sk != (picnic_privatekey_t *)0x0) {
    bVar1 = sk->data[0];
    lowmc = picnic_instance_get((uint)bVar1);
    if (lowmc != (picnic_instance_t *)0x0) {
      len = (ulong)lowmc->input_output_size;
      mzd_from_char_array(&local_a0,sk->data + len * 2 + 1,len);
      mzd_from_char_array(&local_c0,sk->data + 1,(ulong)lowmc->input_output_size);
      lowmc_compute(&lowmc->lowmc,&local_c0,&local_a0,local_80);
      pk->data[0] = bVar1;
      memcpy(pk->data + len + 1,sk->data + len * 2 + 1,(ulong)lowmc->input_output_size);
      mzd_to_char_array(pk->data + 1,local_80,(ulong)lowmc->input_output_size);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_sk_to_pk(const picnic_privatekey_t* sk,
                                              picnic_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_params_t param       = sk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  uint8_t* pk_c        = PK_C(pk);
  uint8_t* pk_pt       = PK_PT(pk, instance);
  const uint8_t* sk_pt = SK_PT(sk, instance);

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, instance->input_output_size);
  mzd_from_char_array(privkey, sk_sk, instance->input_output_size);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  pk->data[0] = param;
  memcpy(pk_pt, sk_pt, instance->input_output_size);
  mzd_to_char_array(pk_c, ciphertext, instance->input_output_size);

  return 0;
}